

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InlinePass::FixDebugDeclare
          (InlinePass *this,Instruction *dbg_declare_inst,
          map<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          *access_chains)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  uint32_t uVar2;
  pointer ppVar3;
  Operand *pOVar4;
  uint local_d4;
  uint local_d0;
  uint32_t i_2;
  uint32_t i_1;
  undefined8 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  Operand local_90;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t access_chain_base;
  int i;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Instruction *access_chain;
  _Self local_30;
  const_iterator it;
  uint32_t var_id;
  map<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *access_chains_local;
  Instruction *dbg_declare_inst_local;
  InlinePass *this_local;
  
  while( true ) {
    it._M_node._4_4_ = opt::Instruction::GetSingleWordInOperand(dbg_declare_inst,3);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
         ::find(access_chains,(key_type_conflict *)((long)&it._M_node + 4));
    access_chain = (Instruction *)
                   std::
                   map<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                   ::end(access_chains);
    bVar1 = std::operator==(&local_30,(_Self *)&access_chain);
    if (bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>::
             operator->(&local_30);
    operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar3->second;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
               &access_chain_base);
    for (local_5c = 0; (int)local_5c < 3; local_5c = local_5c + 1) {
      pOVar4 = opt::Instruction::GetInOperand(dbg_declare_inst,local_5c);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &access_chain_base,pOVar4);
    }
    i_2 = opt::Instruction::GetSingleWordInOperand
                    ((Instruction *)
                     operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    _i_1 = &i_2;
    local_c0 = 1;
    init_list._M_len = 1;
    init_list._M_array = _i_1;
    local_60 = i_2;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
    Operand::Operand(&local_90,SPV_OPERAND_TYPE_ID,&local_b8);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
               &access_chain_base,&local_90);
    Operand::~Operand(&local_90);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
    pOVar4 = opt::Instruction::GetInOperand(dbg_declare_inst,4);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
               &access_chain_base,pOVar4);
    for (local_d0 = 1;
        uVar2 = opt::Instruction::NumInOperands
                          ((Instruction *)
                           operands.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), local_d0 < uVar2;
        local_d0 = local_d0 + 1) {
      pOVar4 = opt::Instruction::GetInOperand
                         ((Instruction *)
                          operands.
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &access_chain_base,pOVar4);
    }
    for (local_d4 = 5; uVar2 = opt::Instruction::NumInOperands(dbg_declare_inst), local_d4 < uVar2;
        local_d4 = local_d4 + 1) {
      pOVar4 = opt::Instruction::GetInOperand(dbg_declare_inst,local_d4);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &access_chain_base,pOVar4);
    }
    opt::Instruction::SetInOperands(dbg_declare_inst,(OperandList *)&access_chain_base);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
               &access_chain_base);
  }
  return;
}

Assistant:

void InlinePass::FixDebugDeclare(
    Instruction* dbg_declare_inst,
    const std::map<uint32_t, Instruction*>& access_chains) {
  do {
    uint32_t var_id =
        dbg_declare_inst->GetSingleWordInOperand(kSpvDebugDeclareVarInIdx);

    // The def-use chains are not kept up to date while inlining, so we need to
    // get the variable by traversing the functions.
    auto it = access_chains.find(var_id);
    if (it == access_chains.end()) {
      return;
    }
    Instruction* access_chain = it->second;

    // If the variable id in the debug declare is an access chain, it is
    // invalid. it needs to be fixed up. The debug declare will be updated so
    // that its Var operand becomes the base of the access chain. The indexes of
    // the access chain are prepended before the indexes of the debug declare.

    std::vector<Operand> operands;
    for (int i = 0; i < kSpvDebugDeclareVarInIdx; i++) {
      operands.push_back(dbg_declare_inst->GetInOperand(i));
    }

    uint32_t access_chain_base =
        access_chain->GetSingleWordInOperand(kSpvAccessChainBaseInIdx);
    operands.push_back(Operand(SPV_OPERAND_TYPE_ID, {access_chain_base}));
    operands.push_back(
        dbg_declare_inst->GetInOperand(kSpvDebugDeclareVarInIdx + 1));

    for (uint32_t i = kSpvAccessChainBaseInIdx + 1;
         i < access_chain->NumInOperands(); ++i) {
      operands.push_back(access_chain->GetInOperand(i));
    }

    for (uint32_t i = kSpvDebugDeclareVarInIdx + 2;
         i < dbg_declare_inst->NumInOperands(); ++i) {
      operands.push_back(dbg_declare_inst->GetInOperand(i));
    }

    dbg_declare_inst->SetInOperands(std::move(operands));
  } while (true);
}